

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_new.cc
# Opt level: O0

int ASN1_template_new(ASN1_VALUE **pval,ASN1_TEMPLATE *tt)

{
  stack_st_ASN1_VALUE *psVar1;
  stack_st_ASN1_VALUE *skval;
  int ret;
  ASN1_ITEM *it;
  ASN1_TEMPLATE *tt_local;
  ASN1_VALUE **pval_local;
  
  if ((tt->flags & 1) == 0) {
    if ((tt->flags & 0x300) == 0) {
      if ((tt->flags & 6) == 0) {
        skval._4_4_ = ASN1_item_ex_new(pval,(ASN1_ITEM *)tt->field_name);
      }
      else {
        psVar1 = sk_ASN1_VALUE_new_null();
        if (psVar1 == (stack_st_ASN1_VALUE *)0x0) {
          skval._4_4_ = 0;
        }
        else {
          *pval = (ASN1_VALUE *)psVar1;
          skval._4_4_ = 1;
        }
      }
      pval_local._4_4_ = skval._4_4_;
    }
    else {
      *pval = (ASN1_VALUE *)0x0;
      pval_local._4_4_ = 1;
    }
  }
  else {
    asn1_template_clear((ASN1_VALUE **)pval,(ASN1_TEMPLATE *)tt);
    pval_local._4_4_ = 1;
  }
  return pval_local._4_4_;
}

Assistant:

static int ASN1_template_new(ASN1_VALUE **pval, const ASN1_TEMPLATE *tt) {
  const ASN1_ITEM *it = ASN1_ITEM_ptr(tt->item);
  int ret;
  if (tt->flags & ASN1_TFLG_OPTIONAL) {
    asn1_template_clear(pval, tt);
    return 1;
  }
  // If ANY DEFINED BY nothing to do

  if (tt->flags & ASN1_TFLG_ADB_MASK) {
    *pval = NULL;
    return 1;
  }
  // If SET OF or SEQUENCE OF, its a STACK
  if (tt->flags & ASN1_TFLG_SK_MASK) {
    STACK_OF(ASN1_VALUE) *skval;
    skval = sk_ASN1_VALUE_new_null();
    if (!skval) {
      ret = 0;
      goto done;
    }
    *pval = (ASN1_VALUE *)skval;
    ret = 1;
    goto done;
  }
  // Otherwise pass it back to the item routine
  ret = ASN1_item_ex_new(pval, it);
done:
  return ret;
}